

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookptravltree.h
# Opt level: O3

void __thiscall cookmem::PtrAVLTree::removeNode(PtrAVLTree *this,Node *root,Node **stack,int depth)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *pNVar3;
  short depth_00;
  long lVar4;
  Node *pNVar5;
  Node *newStack [65];
  PtrAVLTree *pPStack_40240;
  long alStack_40238 [32767];
  PtrAVLTree *local_240;
  Node *local_238;
  long alStack_230 [64];
  
  pNVar1 = root->left;
  pNVar5 = root->right;
  pNVar3 = pNVar5;
  if ((pNVar1 != (Node *)0x0) && (pNVar3 = pNVar1, pNVar5 != (Node *)0x0)) {
    local_240 = this;
    local_238 = pNVar5;
    pNVar2 = pNVar5->left;
    if (pNVar2 != (Node *)0x0) {
      lVar4 = 0;
      depth_00 = 0;
      do {
        alStack_230[lVar4] = (long)pNVar2;
        depth_00 = depth_00 + 1;
        lVar4 = (long)depth_00;
        pNVar3 = (Node *)alStack_230[lVar4 + -1];
        pNVar2 = pNVar3->left;
      } while (pNVar2 != (Node *)0x0);
      if (pNVar3 != pNVar5) {
        (&local_240)[lVar4][2].m_root = (Node *)0x0;
        pNVar2 = balance(&local_238,depth_00);
        if (pNVar2 != (Node *)0x0) {
          pNVar5 = pNVar2;
        }
        pNVar3->left = pNVar1;
        pNVar3->right = pNVar5;
        this = local_240;
        goto LAB_00107c14;
      }
    }
    pNVar5->left = pNVar1;
    pNVar3 = pNVar5;
    this = local_240;
  }
LAB_00107c14:
  if (depth != 0) {
    if (pNVar3 == (Node *)0x0) {
      (&stack[(long)depth + -1]->left)[stack[(long)depth + -1]->size <= root->size] = (Node *)0x0;
    }
    else {
      (&stack[(long)depth + -1]->left)[stack[(long)depth + -1]->size <= pNVar3->size] = pNVar3;
      stack[depth] = pNVar3;
    }
    pNVar3 = balance(stack,(int16_t)depth);
    if (pNVar3 == (Node *)0x0) {
      return;
    }
  }
  this->m_root = pNVar3;
  return;
}

Assistant:

void
    removeNode (Node* root, Node** stack, int depth)
    {
        Node* left = root->left;
        Node* right = root->right;

        Node* newRoot;
        if (left == nullptr)
        {
            newRoot = right;
        }
        else if (right == nullptr)
        {
            newRoot = left;
        }
        else
        {
            // this is a more complicated case.
            // the solution is the move the smallest of the right branch
            // here.
            std::int16_t newDepth;
            Node* newStack[sizeof (Node*) * 8 + 1];
            newStack[0] = right;
            for (newDepth = 0; newStack[newDepth]->left != nullptr; ++newDepth)
            {
                newStack[newDepth + 1] = newStack[newDepth]->left;
            }
            Node* min = newStack[newDepth];
            if (min == right)
            {
                newRoot = right;
                setLeftChild (newRoot, left);
            }
            else
            {
                // first detach min from the parent
                Node* parent = newStack[newDepth - 1];
                parent->left = nullptr;

                // rebalance the right
                Node* newRight = balance (newStack, newDepth);
                if (newRight != nullptr)
                {
                    right = newRight;
                }

                setLeftChild (min, left);
                setRightChild (min, right);

                newRoot = min;
            }
        }

        if (depth == 0)
        {
            m_root = newRoot;
            return;
        }
        if (newRoot == nullptr)
        {
            // so root is the leaf.
            if (root->size < stack[depth - 1]->size)
            {
                stack[depth - 1]->left = nullptr;
            }
            else
            {
                stack[depth - 1]->right = nullptr;
            }
            newRoot = balance (stack, depth);
            if (newRoot != nullptr)
            {
                m_root = newRoot;
            }
            return;
        }

        setParent (newRoot, stack[depth - 1]);

        stack[depth] = newRoot;
        newRoot = balance (stack, depth);

        if (newRoot != nullptr)
        {
            m_root = newRoot;
        }
    }